

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

UA_Boolean
isNodeInTree(UA_NodeStore *ns,UA_NodeId *leafNode,UA_NodeId *nodeToFind,UA_NodeId *referenceTypeIds,
            size_t referenceTypeIdsSize)

{
  ulong uVar1;
  UA_ReferenceNode *pUVar2;
  UA_Boolean UVar3;
  UA_NodeStoreEntry **ppUVar4;
  UA_Node *pUVar5;
  ulong uVar6;
  size_t sVar7;
  UA_NodeId *n2;
  UA_Boolean UVar8;
  
  UVar3 = UA_NodeId_equal(leafNode,nodeToFind);
  UVar8 = true;
  if (!UVar3) {
    ppUVar4 = findNode(ns,leafNode);
    if (ppUVar4 == (UA_NodeStoreEntry **)0x0) {
      pUVar5 = (UA_Node *)0x0;
    }
    else {
      pUVar5 = &(*ppUVar4)->node;
    }
    if (pUVar5 == (UA_Node *)0x0) {
      UVar8 = false;
    }
    else {
      uVar1 = pUVar5->referencesSize;
      UVar8 = uVar1 != 0;
      if (UVar8) {
        pUVar2 = pUVar5->references;
        uVar6 = 0;
        do {
          if ((referenceTypeIdsSize != 0) && (pUVar2[uVar6].isInverse != false)) {
            sVar7 = referenceTypeIdsSize;
            n2 = referenceTypeIds;
            do {
              UVar3 = UA_NodeId_equal(&pUVar2[uVar6].referenceTypeId,n2);
              if ((UVar3) &&
                 (UVar3 = isNodeInTree(ns,&pUVar2[uVar6].targetId.nodeId,nodeToFind,referenceTypeIds
                                       ,referenceTypeIdsSize), UVar3)) {
                return UVar8;
              }
              n2 = n2 + 1;
              sVar7 = sVar7 - 1;
            } while (sVar7 != 0);
          }
          uVar6 = uVar6 + 1;
          UVar8 = uVar6 < uVar1;
        } while (uVar6 != uVar1);
      }
    }
  }
  return UVar8;
}

Assistant:

UA_Boolean
isNodeInTree(UA_NodeStore *ns, const UA_NodeId *leafNode, const UA_NodeId *nodeToFind,
             const UA_NodeId *referenceTypeIds, size_t referenceTypeIdsSize) {
    if(UA_NodeId_equal(leafNode, nodeToFind))
        return true;

    const UA_Node *node = UA_NodeStore_get(ns,leafNode);
    if(!node)
        return false;

    /* Search upwards in the tree */
    for(size_t i = 0; i < node->referencesSize; ++i) {
        if(!node->references[i].isInverse)
            continue;

        /* Recurse only for valid reference types */
        for(size_t j = 0; j < referenceTypeIdsSize; ++j) {
            if(UA_NodeId_equal(&node->references[i].referenceTypeId, &referenceTypeIds[j]) &&
               isNodeInTree(ns, &node->references[i].targetId.nodeId, nodeToFind,
                            referenceTypeIds, referenceTypeIdsSize))
                return true;
        }
    }
    return false;
}